

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O0

void stk::Stk::swap64(uchar *ptr)

{
  uchar uVar1;
  uchar val;
  uchar *ptr_local;
  
  uVar1 = *ptr;
  *ptr = ptr[7];
  ptr[7] = uVar1;
  uVar1 = ptr[1];
  ptr[1] = ptr[6];
  ptr[6] = uVar1;
  uVar1 = ptr[2];
  ptr[2] = ptr[5];
  ptr[5] = uVar1;
  uVar1 = ptr[3];
  ptr[3] = ptr[4];
  ptr[4] = uVar1;
  return;
}

Assistant:

void Stk :: swap64(unsigned char *ptr)
{
  unsigned char val;

  // Swap 1st and 8th bytes
  val = *(ptr);
  *(ptr) = *(ptr+7);
  *(ptr+7) = val;

  // Swap 2nd and 7th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+5);
  *(ptr+5) = val;

  // Swap 3rd and 6th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+3);
  *(ptr+3) = val;

  // Swap 4th and 5th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+1);
  *(ptr+1) = val;
}